

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::FetchCommittedRangeValidity
               (UpdateInfo *info,idx_t start,idx_t end,idx_t result_offset,Vector *result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint uVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  _Head_base<0UL,_unsigned_long_*,_false> _Var6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  buffer_ptr<ValidityBuffer> *local_50;
  long local_48;
  idx_t local_40;
  idx_t local_38;
  
  FlatVector::VerifyFlatVector(result);
  uVar4 = info->N;
  if (uVar4 != 0) {
    lVar8 = (long)&info[1].segment + (ulong)info->max * 4;
    local_50 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar9 = 0;
    local_48 = lVar8;
    local_40 = end;
    do {
      uVar7 = (ulong)*(uint *)((long)&info[1].segment + uVar9 * 4);
      if (start <= uVar7) {
        if (end <= uVar7) {
          return;
        }
        uVar7 = uVar7 + (result_offset - start);
        _Var6._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (*(char *)(lVar8 + uVar9) == '\x01') {
          if (_Var6._M_head_impl != (unsigned_long *)0x0) {
            _Var6._M_head_impl[uVar7 >> 6] =
                 _Var6._M_head_impl[uVar7 >> 6] | 1L << ((byte)uVar7 & 0x3f);
          }
        }
        else {
          if (_Var6._M_head_impl == (unsigned_long *)0x0) {
            local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_38);
            p_Var3 = p_Stack_60;
            peVar2 = local_68;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar2;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var3;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (local_50);
            _Var6._M_head_impl =
                 (pTVar5->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var6._M_head_impl;
            uVar4 = info->N;
            end = local_40;
            lVar8 = local_48;
          }
          bVar1 = (byte)uVar7 & 0x3f;
          _Var6._M_head_impl[uVar7 >> 6] =
               _Var6._M_head_impl[uVar7 >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1)
          ;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar4);
  }
  return;
}

Assistant:

static void FetchCommittedRangeValidity(UpdateInfo &info, idx_t start, idx_t end, idx_t result_offset, Vector &result) {
	auto &result_mask = FlatVector::Validity(result);
	MergeUpdateInfoRangeValidity(info, start, end, result_offset, result_mask);
}